

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall sznet::net::EventLoop::printActiveChannels(EventLoop *this)

{
  pointer ppCVar1;
  Channel *this_00;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer ppCVar6;
  SourceFile file;
  Logger local_1020;
  string local_50;
  
  ppCVar6 = (this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar6 != ppCVar1) {
    iVar5 = (int)&local_1020 + 0xfb0;
    iVar3 = g_logLevel;
    do {
      if (iVar3 < 1) {
        this_00 = *ppCVar6;
        file._8_8_ = 0xd;
        file.m_data = "EventLoop.cpp";
        Logger::Logger(&local_1020,file,0x149,TRACE,"printActiveChannels");
        if ((iVar5 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur & 0xfffffffeU) != 0) {
          *local_1020.m_impl.m_stream.m_buffer.m_cur = '{';
          local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 1;
        }
        Channel::reventsToString_abi_cxx11_(&local_50,this_00);
        sVar2 = local_50._M_string_length;
        uVar4 = iVar5 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur;
        if (local_50._M_string_length < (ulong)(long)(int)uVar4) {
          memcpy(local_1020.m_impl.m_stream.m_buffer.m_cur,local_50._M_dataplus._M_p,
                 local_50._M_string_length);
          local_1020.m_impl.m_stream.m_buffer.m_cur =
               local_1020.m_impl.m_stream.m_buffer.m_cur + sVar2;
          uVar4 = iVar5 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur;
        }
        if (2 < uVar4) {
          local_1020.m_impl.m_stream.m_buffer.m_cur[0] = '}';
          local_1020.m_impl.m_stream.m_buffer.m_cur[1] = ' ';
          local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        Logger::~Logger(&local_1020);
        iVar3 = g_logLevel;
      }
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != ppCVar1);
  }
  return;
}

Assistant:

void EventLoop::printActiveChannels() const
{
	for (const Channel* channel : m_activeChannels)
	{
		LOG_TRACE << "{" << channel->reventsToString() << "} ";
	}
}